

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall
FIX::FieldBase::FieldBase
          (FieldBase *this,int tag,const_iterator valueStart,const_iterator valueEnd,
          const_iterator tagStart,const_iterator tagEnd)

{
  field_metrics fVar1;
  allocator<char> local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_34;
  FieldBase *pFStack_30;
  int tag_local;
  FieldBase *this_local;
  const_iterator tagEnd_local;
  const_iterator tagStart_local;
  const_iterator valueEnd_local;
  const_iterator valueStart_local;
  
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_0032f310;
  this->m_tag = tag;
  local_48._M_current = valueEnd._M_current;
  local_40._M_current = valueStart._M_current;
  local_34 = tag;
  pFStack_30 = this;
  this_local = (FieldBase *)tagEnd._M_current;
  tagEnd_local = tagStart;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)&this->m_string,local_40,local_48,&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::string((string *)&this->m_data);
  fVar1 = calculateMetrics(tagEnd_local,(const_iterator)this_local);
  this->m_metrics = fVar1;
  return;
}

Assistant:

FieldBase(
      int tag,
      std::string::const_iterator valueStart,
      std::string::const_iterator valueEnd,
      std::string::const_iterator tagStart,
      std::string::const_iterator tagEnd)
      : m_tag(tag),
        m_string(valueStart, valueEnd),
        m_metrics(calculateMetrics(tagStart, tagEnd)) {}